

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderStructTests.cpp
# Opt level: O2

int __thiscall deqp::ShaderStructCase::init(ShaderStructCase *this,EVP_PKEY_CTX *ctx)

{
  PixelBufferAccess *access;
  int iVar1;
  Texture2D *this_00;
  Sampler local_a8;
  TextureBinding local_68;
  
  if (this->m_usesTexture == true) {
    this_00 = (Texture2D *)operator_new(0x70);
    glu::Texture2D::Texture2D(this_00,(this->super_ShaderRenderCase).m_renderCtx,0x8058,0x80,0x80);
    this->m_gradientTexture = this_00;
    tcu::Texture2D::allocLevel(&this_00->m_refTexture,0);
    access = (this->m_gradientTexture->m_refTexture).super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_68,0.0);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_a8,1.0);
    tcu::fillWithComponentGradients(access,(Vec4 *)&local_68,(Vec4 *)&local_a8);
    (*this->m_gradientTexture->_vptr_Texture2D[2])();
    local_a8.wrapS = CLAMP_TO_EDGE;
    local_a8.wrapT = CLAMP_TO_EDGE;
    local_a8.wrapR = CLAMP_TO_EDGE;
    local_a8.minFilter = LINEAR;
    local_a8.magFilter = LINEAR;
    local_a8.lodThreshold = 0.0;
    local_a8.normalizedCoords = true;
    local_a8.depthStencilMode = MODE_DEPTH;
    local_a8.compare = COMPAREMODE_NONE;
    local_a8.compareChannel = 0;
    local_a8.borderColor.v.uData[0]._0_1_ = 0;
    local_a8.borderColor.v._1_7_ = 0;
    local_a8.borderColor.v.uData[2]._0_1_ = 0;
    local_a8._45_8_ = 0;
    ctx = (EVP_PKEY_CTX *)&local_68;
    TextureBinding::TextureBinding((TextureBinding *)ctx,this->m_gradientTexture,&local_a8);
    std::vector<deqp::TextureBinding,_std::allocator<deqp::TextureBinding>_>::
    emplace_back<deqp::TextureBinding>
              (&(this->super_ShaderRenderCase).m_textures,(TextureBinding *)ctx);
  }
  iVar1 = ShaderRenderCase::init(&this->super_ShaderRenderCase,ctx);
  return iVar1;
}

Assistant:

void ShaderStructCase::init(void)
{
	if (m_usesTexture)
	{
		m_gradientTexture = new glu::Texture2D(m_renderCtx, GL_RGBA8, 128, 128);

		m_gradientTexture->getRefTexture().allocLevel(0);
		tcu::fillWithComponentGradients(m_gradientTexture->getRefTexture().getLevel(0), tcu::Vec4(0.0f),
										tcu::Vec4(1.0f));
		m_gradientTexture->upload();

		m_textures.push_back(TextureBinding(
			m_gradientTexture, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::CLAMP_TO_EDGE,
											tcu::Sampler::CLAMP_TO_EDGE, tcu::Sampler::LINEAR, tcu::Sampler::LINEAR)));
		DE_ASSERT(m_textures.size() == 1);
	}
	ShaderRenderCase::init();
}